

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeForces::addType(FluctuatingChargeForces *this,AtomType *atomType)

{
  bool bVar1;
  uint uVar2;
  value_type vVar3;
  size_type sVar4;
  reference pvVar5;
  undefined1 uVar6;
  AtomType *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int fqtid;
  int atid;
  FluctuatingChargeAdapter fqa;
  FluctuatingChargeAtomData data;
  Polynomial<double> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  errorStruct *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  value_type_conflict1 *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  _Rb_tree_const_iterator<int> local_d8;
  bool in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff31;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_c8;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar8;
  FluctuatingChargeAdapter local_70;
  RealType local_68;
  RealType local_60;
  int local_58;
  RealType local_50;
  AtomType *local_10;
  
  local_10 = in_RSI;
  FluctuatingChargeAtomData::FluctuatingChargeAtomData((FluctuatingChargeAtomData *)0x4250d1);
  FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_70,local_10);
  bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x4250f5);
  if (bVar1) {
    local_60 = FluctuatingChargeAdapter::getElectronegativity
                         ((FluctuatingChargeAdapter *)
                          CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30));
    local_68 = FluctuatingChargeAdapter::getHardness
                         ((FluctuatingChargeAdapter *)
                          CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30));
    local_58 = FluctuatingChargeAdapter::getSlaterN
                         ((FluctuatingChargeAdapter *)
                          CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30));
    local_50 = FluctuatingChargeAdapter::getSlaterZeta
                         ((FluctuatingChargeAdapter *)
                          CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30));
    FluctuatingChargeAdapter::getSelfPolynomial
              ((FluctuatingChargeAdapter *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Polynomial<double>::operator=
              ((Polynomial<double> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x4251cf);
  }
  uVar2 = AtomType::getIdent(local_10);
  uVar8 = uVar2;
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x425226);
  vVar3 = (value_type)sVar4;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT44(uVar2,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
  local_d8 = pVar7.first._M_node;
  uVar6 = pVar7.second;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_c8,(type)&local_d8);
  if ((local_c8.second & 1U) == 0) {
    in_stack_fffffffffffffec8 = &painCave;
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeForces already had a previous fluctuating charge entry with ident %d\n"
             ,(ulong)uVar8);
    in_stack_fffffffffffffec8->severity = 3;
    in_stack_fffffffffffffec8->isFatal = 0;
    simError();
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),(long)(int)uVar8);
  *pvVar5 = vVar3;
  std::vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ::push_back((vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
               *)CONCAT17(uVar6,in_stack_fffffffffffffed0),(value_type *)in_stack_fffffffffffffec8);
  FluctuatingChargeAtomData::~FluctuatingChargeAtomData((FluctuatingChargeAtomData *)0x425341);
  return;
}

Assistant:

void FluctuatingChargeForces::addType(AtomType* atomType) {
    FluctuatingChargeAtomData data;
    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) {
      data.electronegativity = fqa.getElectronegativity();
      data.hardness          = fqa.getHardness();
      data.slaterN           = fqa.getSlaterN();
      data.slaterZeta        = fqa.getSlaterZeta();
      data.vself_            = fqa.getSelfPolynomial();
    }
    int atid  = atomType->getIdent();
    int fqtid = FQtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = FQtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeForces already had a previous fluctuating "
               "charge entry with ident %d\n",
               atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }
    FQtids[atid] = fqtid;
    FQMap.push_back(data);
  }